

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall QtPrivate::QGenericArrayOps<QString>::eraseFirst(QGenericArrayOps<QString> *this)

{
  QString **ppQVar1;
  qsizetype *pqVar2;
  QString *pQVar3;
  Data *pDVar4;
  
  pQVar3 = (this->super_QArrayDataPointer<QString>).ptr;
  pDVar4 = (pQVar3->d).d;
  if (pDVar4 != (Data *)0x0) {
    LOCK();
    (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((pQVar3->d).d)->super_QArrayData,2,0x10);
    }
  }
  ppQVar1 = &(this->super_QArrayDataPointer<QString>).ptr;
  *ppQVar1 = *ppQVar1 + 1;
  pqVar2 = &(this->super_QArrayDataPointer<QString>).size;
  *pqVar2 = *pqVar2 + -1;
  return;
}

Assistant:

void eraseFirst() noexcept
    {
        Q_ASSERT(this->isMutable());
        Q_ASSERT(this->size);
        this->begin()->~T();
        ++this->ptr;
        --this->size;
    }